

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<int> __thiscall
Omega_h::coalesce<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  int *piVar1;
  LO size_in;
  ulong *puVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  ulong *puVar5;
  void *in_RDX;
  long lVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Read<int> RVar11;
  Write<int> out;
  type f;
  value_type array;
  vector<int,_std::allocator<int>_> offsets;
  Write<int> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [56];
  Alloc *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (*(long *)arrays == *(long *)(arrays + 8)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(*(long *)(arrays + 8) - *(long *)arrays >> 4) + 1,
               (allocator_type *)local_98);
    if ((Alloc *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start == (Alloc *)0x0) {
      fail("assertion %s failed at %s +%d\n","offsets.data() != nullptr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x1c2);
    }
    *(int *)(size_t *)
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = 0;
    puVar5 = *(ulong **)arrays;
    lVar6 = (long)*(ulong **)(arrays + 8) - (long)puVar5 >> 4;
    if (*(ulong **)(arrays + 8) != puVar5) {
      uVar8 = lVar6 + 1;
      uVar9 = 2;
      if (2 < uVar8) {
        uVar9 = uVar8;
      }
      uVar8 = 1;
      do {
        puVar5 = puVar5 + 2;
        puVar2 = (ulong *)*puVar5;
        if (((ulong)puVar2 & 1) == 0) {
          uVar10 = *puVar2;
        }
        else {
          uVar10 = (ulong)puVar2 >> 3;
        }
        *(int *)((long)(size_t *)
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar8 * 4) =
             (int)(uVar10 >> 2) +
             *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 * 4 + -4);
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    size_in = *(LO *)((long)(size_t *)
                            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6 * 4);
    local_98._0_8_ = (Alloc *)local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
    local_50 = (Alloc *)this;
    Write<int>::Write(&local_a8,size_in,(string *)local_98);
    if ((Alloc *)local_98._0_8_ != (Alloc *)local_88) {
      operator_delete((void *)local_98._0_8_,CONCAT44(local_88._4_4_,local_88._0_4_) + 1);
    }
    lVar6 = *(long *)arrays;
    if (*(long *)(arrays + 8) != lVar6) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        local_88._40_8_ = *(ulong *)(lVar6 + -8 + lVar7);
        if ((local_88._40_8_ & 7) == 0 && (Alloc *)local_88._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88._40_8_ = ((Alloc *)local_88._40_8_)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_88._40_8_)->use_count = ((Alloc *)local_88._40_8_)->use_count + 1;
          }
        }
        local_88._16_8_ = *(size_type *)(lVar6 + lVar7);
        local_88._0_4_ =
             *(pointer)((long)(size_t *)
                              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar8 * 4);
        local_98._0_8_ = local_a8.shared_alloc_.alloc;
        if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
            local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_98._0_8_ = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_a8.shared_alloc_.alloc)->use_count =
                 (local_a8.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_98._8_8_ = local_a8.shared_alloc_.direct_ptr;
        local_88._8_8_ = local_88._40_8_;
        if ((local_88._40_8_ & 7) == 0 && (Alloc *)local_88._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88._8_8_ = *(size_t *)local_88._40_8_ * 8 + 1;
          }
          else {
            *(int *)(local_88._40_8_ + 0x30) = *(int *)(local_88._40_8_ + 0x30) + 1;
          }
        }
        if ((local_88._40_8_ & 1) == 0) {
          uVar9 = *(size_t *)local_88._40_8_;
        }
        else {
          uVar9 = (ulong)local_88._40_8_ >> 3;
        }
        local_88._48_8_ = local_88._16_8_;
        parallel_for<Omega_h::coalesce<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                  ((LO)(uVar9 >> 2),(type *)local_98,"coalesce");
        uVar4 = local_88._8_8_;
        if ((local_88._8_8_ & 7) == 0 && (Alloc *)local_88._8_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_88._8_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_88._8_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        uVar4 = local_98._0_8_;
        if ((local_98._0_8_ & 7) == 0 && (Alloc *)local_98._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_98._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_98._0_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        uVar4 = local_88._40_8_;
        if ((local_88._40_8_ & 7) == 0 && (Alloc *)local_88._40_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_88._40_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_88._40_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        uVar8 = uVar8 + 1;
        lVar6 = *(long *)arrays;
        lVar7 = lVar7 + 0x10;
      } while (uVar8 < (ulong)(*(long *)(arrays + 8) - lVar6 >> 4));
    }
    this = (Omega_h *)local_50;
    local_88._24_8_ = local_a8.shared_alloc_.alloc;
    local_88._32_8_ = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_88._24_8_ = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)local_50,(Write<int> *)(local_88 + 0x18));
    uVar4 = local_88._24_8_;
    in_RDX = extraout_RDX;
    if ((local_88._24_8_ & 7) == 0 && (Alloc *)local_88._24_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_88._24_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_88._24_8_);
        operator_delete((void *)uVar4,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar3 = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
    if ((Alloc *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (Alloc *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      in_RDX = extraout_RDX_02;
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar11.write_.shared_alloc_;
}

Assistant:

Read<T> coalesce(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  std::vector<LO> offsets(arrays.size() + 1);
  OMEGA_H_CHECK(offsets.data() != nullptr);
  offsets[0] = 0;
  for (std::size_t i = 1; i <= arrays.size(); ++i) {
    offsets[i] = offsets[i - 1] + arrays[i].size();
  }
  auto out_size = offsets[arrays.size()];
  auto out = Write<T>(out_size);
  for (std::size_t i = 0; i < arrays.size(); ++i) {
    auto array = arrays[std::size_t(i)];
    auto offset = offsets[i];
    auto f = OMEGA_H_LAMBDA(LO j) { out[offset + j] = array[j]; };
    parallel_for(array.size(), f, "coalesce");
  }
  return out;
}